

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

void roaring64_bitmap_add_bulk(roaring64_bitmap_t *r,roaring64_bulk_context_t *context,uint64_t val)

{
  ulong *puVar1;
  container_t *c;
  ulong uVar2;
  int iVar3;
  art_val_t *leaf;
  leaf_t *plVar4;
  container_t *pcVar5;
  uint8_t typecode;
  uint8_t typecode2;
  uint8_t high48 [6];
  uint8_t local_31;
  uint local_30;
  ushort local_2c;
  
  local_30 = (uint)(byte)(val >> 0x38) | ((uint)(val >> 0x20) & 0xff0000) >> 8 |
             (uint)(val >> 0x18) & 0xff0000 | (uint)(val >> 8) & 0xff000000;
  local_2c = (ushort)(val >> 0x18) & 0xff | (ushort)(val >> 8) & 0xff00;
  puVar1 = context->leaf;
  if ((puVar1 != (ulong *)0x0) &&
     (iVar3 = art_compare_keys(context->high_bytes,(art_key_chunk_t *)&local_30), iVar3 == 0)) {
    c = r->containers[*puVar1 >> 8];
    typecode = (uint8_t)*puVar1;
    pcVar5 = container_add(c,(uint16_t)val,typecode,&local_31);
    if (pcVar5 == c) {
      return;
    }
    container_free(c,typecode);
    uVar2 = *puVar1;
    r->containers[uVar2 >> 8] = pcVar5;
    *puVar1 = CONCAT71((int7)(uVar2 >> 8),local_31);
    return;
  }
  leaf = art_find(&r->art,(art_key_chunk_t *)&local_30);
  plVar4 = containerptr_roaring64_bitmap_add(r,(uint8_t *)&local_30,(uint16_t)val,leaf);
  context->leaf = plVar4;
  *(uint *)context->high_bytes = local_30;
  *(ushort *)(context->high_bytes + 4) = local_2c;
  return;
}

Assistant:

void roaring64_bitmap_add_bulk(roaring64_bitmap_t *r,
                               roaring64_bulk_context_t *context,
                               uint64_t val) {
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);
    leaf_t *leaf = context->leaf;
    if (leaf != NULL && compare_high48(context->high_bytes, high48) == 0) {
        // We're at a container with the correct high bits.
        uint8_t typecode1 = get_typecode(*leaf);
        container_t *container1 = get_container(r, *leaf);
        uint8_t typecode2;
        container_t *container2 =
            container_add(container1, low16, typecode1, &typecode2);
        if (container2 != container1) {
            container_free(container1, typecode1);
            replace_container(r, leaf, container2, typecode2);
        }
    } else {
        // We're not positioned anywhere yet or the high bits of the key
        // differ.
        leaf = (leaf_t *)art_find(&r->art, high48);
        context->leaf =
            containerptr_roaring64_bitmap_add(r, high48, low16, leaf);
        memcpy(context->high_bytes, high48, ART_KEY_BYTES);
    }
}